

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

PackageMempoolAcceptResult *
ProcessNewPackage(PackageMempoolAcceptResult *__return_storage_ptr__,Chainstate *active_chainstate,
                 CTxMemPool *pool,Package *package,bool test_accept,
                 optional<CFeeRate> *client_maxfeerate)

{
  TxValidationResult TVar1;
  CChainParams *pCVar2;
  element_type *peVar3;
  long *plVar4;
  COutPoint *pCVar5;
  CTxIn *pCVar6;
  uchar *puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  PackageValidationState state;
  PackageValidationState state_00;
  PackageValidationState state_01;
  PackageValidationState state_02;
  TxValidationState state_03;
  TxValidationState state_04;
  PackageValidationState state_05;
  Package *pPVar12;
  bool bVar13;
  int64_t iVar14;
  pointer pcVar15;
  CTxMemPoolEntry *pCVar16;
  CTxMemPoolEntry **ppCVar17;
  undefined1 *extraout_RAX;
  undefined1 *puVar18;
  const_iterator cVar19;
  mapped_type *pmVar20;
  iterator iVar21;
  CCoinsViewCache *pCVar22;
  pointer psVar23;
  COutPoint *hashTx;
  _Alloc_hider hash;
  __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> _Var24;
  value_type *pvVar25;
  transaction_identifier<true> *__args;
  pointer pAVar26;
  long lVar27;
  undefined1 auVar28 [8];
  pointer *ppAVar29;
  undefined4 uVar30;
  undefined7 in_register_00000081;
  pointer psVar31;
  value_type *__x;
  CTxIn *input;
  pointer psVar32;
  COutPoint *outpoint;
  __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> __it;
  Txid *txid;
  pointer *ppsVar33;
  Package *pPVar34;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  pVar35;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  PackageMempoolAcceptResult *result;
  vector<COutPoint,_std::allocator<COutPoint>_> coins_to_uncache;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  txns_package_eval;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  unconfirmed_parent_txids;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  BlockValidationState state_dummy;
  TxValidationState mempool_full_state;
  PackageMempoolAcceptResult multi_submission_result;
  ATMPArgs args;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  individual_results_nonfinal;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  results_final;
  PackageValidationState package_state_quit_early;
  undefined8 in_stack_fffffffffffff868;
  undefined8 in_stack_fffffffffffff870;
  Wtxid *__args_00;
  undefined4 in_stack_fffffffffffff888;
  char cVar36;
  byte in_stack_fffffffffffff890;
  undefined7 in_stack_fffffffffffff891;
  value_type *in_stack_fffffffffffff898;
  value_type *in_stack_fffffffffffff8a0;
  _Alloc_hider _Var37;
  COutPoint *pCStack_750;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_738;
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_718;
  ATMPArgs local_6d0;
  unique_lock<std::recursive_mutex> local_690;
  undefined1 local_680 [8];
  CCoinsViewBacked local_678;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  _Alloc_hider local_658;
  size_type local_650;
  undefined1 local_648 [248];
  CoinsCachePair *local_550;
  CoinsCachePair *local_548;
  uint8_t local_540;
  direct_or_indirect local_530;
  uint local_514;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_508;
  undefined **local_4b0;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_4a0;
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_458;
  CCoinsView local_408;
  Chainstate *local_400;
  _Rb_tree<_270907ca_> local_3e0;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_3b0;
  _Base_ptr local_388;
  pointer *local_380 [2];
  pointer local_370 [2];
  double *local_360 [2];
  double local_350 [2];
  _Base_ptr local_340;
  pointer *local_338 [2];
  pointer local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  string local_2f8;
  undefined1 local_2d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 local_290 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  undefined1 local_280 [24];
  pointer local_268 [2];
  undefined1 local_258 [16];
  undefined1 local_248 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_230;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_200;
  undefined1 local_1c8 [8];
  _Alloc_hider _Stack_1c0;
  undefined1 local_1b8 [8];
  undefined1 auStack_1b0 [8];
  undefined1 local_1a8 [16];
  _Alloc_hider local_198;
  undefined1 local_190 [8];
  undefined1 local_188 [16];
  _Rb_tree_node_base local_178;
  bool local_158;
  _Storage<long,_true> local_150;
  bool local_148;
  bool local_138;
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_130;
  bool local_118;
  _Storage<uint256,_true> local_110;
  bool local_f0;
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_e0;
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_b0;
  element_type *local_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  pointer local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint64_t local_38;
  
  uVar30 = (undefined4)CONCAT71(in_register_00000081,test_accept);
  local_38 = *(uint64_t *)(in_FS_OFFSET + 0x28);
  psVar23 = (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar32 = (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar23 == psVar32) {
    __assert_fail("!package.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x760,
                  "PackageMempoolAcceptResult ProcessNewPackage(Chainstate &, CTxMemPool &, const Package &, bool, const std::optional<CFeeRate> &)"
                 );
  }
  lVar27 = (long)psVar32 - (long)psVar23 >> 6;
  psVar31 = psVar23;
  if (0 < lVar27) {
    psVar31 = (pointer)((long)&(psVar23->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + ((long)psVar32 - (long)psVar23 & 0xffffffffffffffc0U));
    lVar27 = lVar27 + 1;
    psVar23 = psVar23 + 2;
    do {
      if (psVar23[-2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar23 = psVar23 + -2;
        goto LAB_00aeb51c;
      }
      if (psVar23[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar23 = psVar23 + -1;
        goto LAB_00aeb51c;
      }
      if ((psVar23->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (element_type *)0x0) goto LAB_00aeb51c;
      if (psVar23[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar23 = psVar23 + 1;
        goto LAB_00aeb51c;
      }
      lVar27 = lVar27 + -1;
      psVar23 = psVar23 + 4;
    } while (1 < lVar27);
  }
  lVar27 = (long)psVar32 - (long)psVar31 >> 4;
  if (lVar27 == 1) {
LAB_00aeb4ff:
    psVar23 = psVar31;
    if ((psVar31->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      psVar23 = psVar32;
    }
  }
  else if (lVar27 == 2) {
LAB_00aeb4f5:
    psVar23 = psVar31;
    if ((psVar31->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      psVar31 = psVar31 + 1;
      goto LAB_00aeb4ff;
    }
  }
  else {
    psVar23 = psVar32;
    if ((lVar27 == 3) &&
       (psVar23 = psVar31,
       (psVar31->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
       (element_type *)0x0)) {
      psVar31 = psVar31 + 1;
      goto LAB_00aeb4f5;
    }
  }
LAB_00aeb51c:
  if (psVar23 != psVar32) {
    __assert_fail("std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;})"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x761,
                  "PackageMempoolAcceptResult ProcessNewPackage(Chainstate &, CTxMemPool &, const Package &, bool, const std::optional<CFeeRate> &)"
                 );
  }
  hash._M_p = (pointer)0x0;
  pCStack_750 = (COutPoint *)0x0;
  pCVar2 = (active_chainstate->m_chainman->m_options).chainparams;
  if (test_accept) {
    iVar14 = GetTime();
    cVar36 = (char)uVar30;
    local_1c8._0_4_ = SUB84(pCVar2,0);
    local_1c8._4_4_ = (undefined4)((ulong)pCVar2 >> 0x20);
    _Stack_1c0._M_p._0_4_ = (_Rb_tree_color)iVar14;
    _Stack_1c0._M_p._4_4_ = (TxValidationResult)((ulong)iVar14 >> 0x20);
    local_1b8._0_4_ = local_1b8._0_4_ & 0xffffff00;
    auStack_1b0 = (undefined1  [8])&stack0xfffffffffffff8a8;
    local_1a8[0] = true;
    local_198._M_p = local_198._M_p & 0xffffffffffffff00;
    local_1a8._1_4_ = 0;
    local_190 = (undefined1  [8])((ulong)local_190 & 0xffffffffffffff00);
    anon_unknown.dwarf_3f792fb::MemPoolAccept::MemPoolAccept
              ((MemPoolAccept *)local_680,pool,active_chainstate);
    anon_unknown.dwarf_3f792fb::MemPoolAccept::AcceptMultipleTransactions
              (__return_storage_ptr__,(MemPoolAccept *)local_680,package,(ATMPArgs *)local_1c8);
    goto LAB_00aed050;
  }
  local_6d0.m_accept_time = GetTime();
  local_6d0.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK =
       *(CFeeRate *)
        &(client_maxfeerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
         super__Optional_payload_base<CFeeRate>._M_payload;
  local_6d0.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged =
       (client_maxfeerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
       super__Optional_payload_base<CFeeRate>._M_engaged;
  local_6d0.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._9_7_ =
       *(undefined7 *)
        &(client_maxfeerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
         super__Optional_payload_base<CFeeRate>.field_0x9;
  local_6d0.m_bypass_limits = false;
  local_6d0.m_coins_to_uncache =
       (vector<COutPoint,_std::allocator<COutPoint>_> *)&stack0xfffffffffffff8a8;
  local_6d0.m_test_accept = false;
  local_6d0.m_allow_replacement = true;
  local_6d0.m_allow_sibling_eviction = false;
  local_6d0.m_package_submission = true;
  local_6d0.m_package_feerates = true;
  local_6d0.m_allow_carveouts = false;
  local_6d0.m_chainparams = pCVar2;
  anon_unknown.dwarf_3f792fb::MemPoolAccept::MemPoolAccept
            ((MemPoolAccept *)local_680,pool,active_chainstate);
  local_78._M_p = (pointer)&local_68;
  local_80 = (element_type *)0x0;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_58._M_p = (pointer)&local_48;
  local_50 = (pointer)0x0;
  local_48._M_local_buf[0] = '\0';
  bVar13 = IsWellFormedPackage(package,(PackageValidationState *)&local_80,true);
  if (bVar13) {
    bVar13 = IsChildWithParents(package);
    if (!bVar13) {
      local_248[0] = '\x1e';
      local_248[1] = '\0';
      local_248[2] = '\0';
      local_248[3] = '\0';
      local_248[4] = '\0';
      local_248[5] = '\0';
      local_248[6] = '\0';
      local_248[7] = '\0';
      local_1c8 = (undefined1  [8])local_1b8;
      pcVar15 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1c8,(size_type *)local_248,0);
      local_1c8._0_4_ = SUB84(pcVar15,0);
      local_1c8._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
      puVar18 = local_248 + 0x10;
      local_1b8._0_4_ = (undefined4)CONCAT71(local_248._1_7_,local_248[0]);
      local_1b8._4_4_ = SUB74(local_248._1_7_,3);
      builtin_strncpy(pcVar15,"package-not-child-with-parents",0x1e);
      pcVar15[CONCAT71(local_248._1_7_,local_248[0])] = '\0';
      local_248[0] = SUB81(puVar18,0);
      local_248._1_7_ = (undefined7)((ulong)puVar18 >> 8);
      local_248[8] = _S_red;
      local_248._9_7_ = 0;
      local_248[0x10] = '\0';
      _Stack_1c0._M_p._0_4_ = local_1b8._0_4_;
      _Stack_1c0._M_p._4_4_ = local_1b8._4_4_;
      ValidationState<PackageValidationResult>::Invalid
                ((ValidationState<PackageValidationResult> *)&local_80,PCKG_POLICY,
                 (string *)local_1c8,(string *)local_248);
      if ((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]) != puVar18) {
        operator_delete((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]),
                        CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
      }
      if ((CChainParams *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != (CChainParams *)local_1b8) {
        operator_delete((CChainParams *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                        CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1);
      }
      local_1c8._0_4_ = SUB84(local_80,0);
      local_1c8._4_4_ = (undefined4)((ulong)local_80 >> 0x20);
      _Stack_1c0._M_p = auStack_1b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_1c0,local_78._M_p,local_78._M_p + local_70);
      local_1a8._8_8_ = local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1a8 + 8),local_58._M_p,local_50 + (long)local_58._M_p);
      local_248[0x10] = '\0';
      local_248._17_7_ = 0;
      local_248[0] = false;
      local_248[1] = '\0';
      local_248[2] = '\0';
      local_248[3] = '\0';
      local_248[4] = '\0';
      local_248[5] = '\0';
      local_248[6] = '\0';
      local_248[7] = '\0';
      local_248[8] = _S_red;
      local_248._9_7_ = 0;
      aStack_230._M_local_buf[0] = (char)(local_248 + 8);
      aStack_230._1_7_ = (undefined7)((ulong)(local_248 + 8) >> 8);
      local_220._M_p = (pointer)0x0;
      state_00.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)in_stack_fffffffffffff870;
      state_00.super_ValidationState<PackageValidationResult>.m_mode =
           (int)in_stack_fffffffffffff868;
      state_00.super_ValidationState<PackageValidationResult>.m_result =
           (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
      state_00.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
           (size_type)package;
      state_00.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = (size_type)__return_storage_ptr__;
      state_00.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_4_ =
           in_stack_fffffffffffff888;
      state_00.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._12_4_ =
           uVar30;
      state_00.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._0_1_
           = in_stack_fffffffffffff890;
      state_00.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._1_7_
           = in_stack_fffffffffffff891;
      state_00.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
           (size_type)in_stack_fffffffffffff898;
      state_00.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity = (size_type)in_stack_fffffffffffff8a0;
      state_00.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
           hash._M_p;
      aStack_230._M_local_buf[8] = aStack_230._M_local_buf[0];
      aStack_230._9_7_ = aStack_230._1_7_;
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                (__return_storage_ptr__,state_00,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)local_1c8);
      cVar36 = (char)uVar30;
      goto LAB_00aebb3f;
    }
    __args_00 = (Wtxid *)(package->
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)__args_00 -
               (long)(package->
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x11) {
      __assert_fail("package.size() > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0x6a3,
                    "PackageMempoolAcceptResult (anonymous namespace)::MemPoolAccept::AcceptPackage(const Package &, ATMPArgs &)"
                   );
    }
    SaltedTxidHasher::SaltedTxidHasher((SaltedTxidHasher *)&local_718);
    local_718._M_buckets = &local_718._M_single_bucket;
    local_718._M_bucket_count = 1;
    local_718._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_718._M_element_count = 0;
    local_718._M_rehash_policy._M_max_load_factor = 1.0;
    local_718._M_rehash_policy._M_next_resize = 0;
    local_718._M_single_bucket = (__node_base_ptr)0x0;
    psVar23 = (package->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar32 = (package->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_finish + -1;
    if (psVar23 != psVar32) {
      do {
        peVar3 = (psVar23->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_1c8._0_4_ =
             *(undefined4 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        local_1c8._4_4_ =
             *(undefined4 *)
              ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4);
        _Stack_1c0._M_p._0_4_ =
             *(_Rb_tree_color *)
              ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        _Stack_1c0._M_p._4_4_ =
             *(TxValidationResult *)
              ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
        local_1b8._0_4_ =
             *(undefined4 *)
              ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        puVar7 = (uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x14);
        local_1b8[4] = puVar7[0];
        local_1b8[5] = puVar7[1];
        local_1b8[6] = puVar7[2];
        local_1b8[7] = puVar7[3];
        auStack_1b0._0_4_ =
             *(undefined4 *)
              ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        auStack_1b0._4_4_ =
             *(undefined4 *)
              ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1c);
        local_248[0] = SUB81(&local_718,0);
        local_248._1_7_ = (undefined7)((ulong)&local_718 >> 8);
        std::
        _Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<uint256_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uint256,true>>>>
                  ((_Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_718,local_1c8,local_248);
        psVar23 = psVar23 + 1;
      } while (psVar23 != psVar32);
    }
    pCVar22 = Chainstate::CoinsTip(local_400);
    plVar4 = *(long **)((((Txid *)(__args_00 + -1))->m_wrapped).super_base_blob<256U>.m_data.
                        _M_elems + 0x10);
    outpoint = (COutPoint *)*plVar4;
    pCVar5 = (COutPoint *)plVar4[1];
    if (outpoint != pCVar5) {
      do {
        bVar13 = CCoinsViewCache::HaveCoinInCache(pCVar22,outpoint);
        if (!bVar13) {
          if (pCStack_750 == (COutPoint *)0x0) {
            std::vector<COutPoint,std::allocator<COutPoint>>::_M_realloc_insert<COutPoint_const&>
                      ((vector<COutPoint,std::allocator<COutPoint>> *)&stack0xfffffffffffff8a8,
                       (iterator)0x0,outpoint);
          }
          else {
            pCStack_750->n = outpoint->n;
            uVar8 = *(undefined8 *)(outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar9 = *(undefined8 *)
                     ((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            uVar10 = *(undefined8 *)
                      ((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            *(undefined8 *)
             ((pCStack_750->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
                 *(undefined8 *)
                  ((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            *(undefined8 *)
             ((pCStack_750->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar10;
            *(undefined8 *)(pCStack_750->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems =
                 uVar8;
            *(undefined8 *)((pCStack_750->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
                 = uVar9;
            pCStack_750 = pCStack_750 + 1;
          }
        }
        outpoint = (COutPoint *)&outpoint[2].n;
      } while (outpoint != pCVar5);
    }
    pCVar22 = Chainstate::CoinsTip(local_400);
    CCoinsViewBacked::SetBackend(&local_678,(CCoinsView *)pCVar22);
    plVar4 = *(long **)((((Txid *)(__args_00 + -1))->m_wrapped).super_base_blob<256U>.m_data.
                        _M_elems + 0x10);
    __it._M_current = (CTxIn *)*plVar4;
    pCVar6 = (CTxIn *)plVar4[1];
    local_1c8 = (undefined1  [8])local_680;
    lVar27 = ((long)pCVar6 - (long)__it._M_current >> 3) * 0x4ec4ec4ec4ec4ec5 >> 2;
    _Stack_1c0._M_p = (pointer)&local_718;
    if (0 < lVar27) {
      lVar27 = lVar27 + 1;
      do {
        bVar13 = __gnu_cxx::__ops::
                 _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                 ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                               *)local_1c8,__it);
        _Var24._M_current = __it._M_current;
        if (bVar13) goto LAB_00aebba2;
        bVar13 = __gnu_cxx::__ops::
                 _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                 ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                               *)local_1c8,__it._M_current + 1);
        _Var24._M_current = __it._M_current + 1;
        if (bVar13) goto LAB_00aebba2;
        bVar13 = __gnu_cxx::__ops::
                 _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                 ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                               *)local_1c8,__it._M_current + 2);
        _Var24._M_current = __it._M_current + 2;
        if (bVar13) goto LAB_00aebba2;
        bVar13 = __gnu_cxx::__ops::
                 _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                 ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                               *)local_1c8,__it._M_current + 3);
        _Var24._M_current = __it._M_current + 3;
        if (bVar13) goto LAB_00aebba2;
        __it._M_current = __it._M_current + 4;
        lVar27 = lVar27 + -1;
      } while (1 < lVar27);
    }
    lVar27 = ((long)pCVar6 - (long)__it._M_current >> 3) * 0x4ec4ec4ec4ec4ec5;
    if (lVar27 == 1) {
LAB_00aeb908:
      bVar13 = __gnu_cxx::__ops::
               _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
               ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                             *)local_1c8,__it);
      _Var24._M_current = __it._M_current;
      if (!bVar13) {
        _Var24._M_current = pCVar6;
      }
    }
    else if (lVar27 == 2) {
LAB_00aeb8f0:
      bVar13 = __gnu_cxx::__ops::
               _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
               ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                             *)local_1c8,__it);
      _Var24._M_current = __it._M_current;
      if (!bVar13) {
        __it._M_current = __it._M_current + 1;
        goto LAB_00aeb908;
      }
    }
    else {
      _Var24._M_current = pCVar6;
      if (lVar27 == 3) {
        bVar13 = __gnu_cxx::__ops::
                 _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                 ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                               *)local_1c8,__it);
        _Var24._M_current = __it._M_current;
        if (!bVar13) {
          __it._M_current = __it._M_current + 1;
          goto LAB_00aeb8f0;
        }
      }
    }
LAB_00aebba2:
    if (_Var24._M_current == pCVar6) {
      CCoinsViewBacked::SetBackend(&local_678,&local_408);
      local_690._M_device = (mutex_type *)((long)local_680 + 0x58);
      local_690._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&local_690);
      local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_b0._M_impl.super__Rb_tree_header._M_header;
      local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_e0._M_impl.super__Rb_tree_header._M_header;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_738.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_738.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_738.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __x = (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
      pvVar25 = (package->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
      local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
      if (__x == pvVar25) {
LAB_00aec4ce:
        if (local_738.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_738.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00aec503;
        anon_unknown.dwarf_3f792fb::MemPoolAccept::AcceptSubPackage
                  ((PackageMempoolAcceptResult *)local_248,(MemPoolAccept *)local_680,&local_738,
                   &local_6d0);
      }
      else {
        in_stack_fffffffffffff890 = 0;
        in_stack_fffffffffffff891 = 0;
        in_stack_fffffffffffff898 = pvVar25;
        do {
          peVar3 = (__x->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          uVar8 = *(undefined8 *)
                   (peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uVar9 = *(undefined8 *)
                   ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                   8);
          uVar10 = *(undefined8 *)
                    ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x10);
          uVar11 = *(undefined8 *)
                    ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x18);
          local_1b8._1_3_ = (undefined3)uVar10;
          local_1b8._4_4_ = (undefined4)((ulong)uVar10 >> 0x18);
          auStack_1b0[0] = (undefined1)((ulong)uVar10 >> 0x38);
          auStack_1b0._1_3_ = (undefined3)uVar11;
          auStack_1b0._4_4_ = (undefined4)((ulong)uVar11 >> 0x18);
          local_1a8[0] = (undefined1)((ulong)uVar11 >> 0x38);
          local_1c8._1_3_ = (undefined3)uVar8;
          local_1c8[0] = 1;
          local_1c8._4_4_ = (undefined4)((ulong)uVar8 >> 0x18);
          _Stack_1c0._M_p._0_1_ = SUB81((ulong)uVar8 >> 0x38,0);
          _Stack_1c0._M_p._1_3_ = (undefined3)uVar9;
          _Stack_1c0._M_p._4_4_ = (TxValidationResult)((ulong)uVar9 >> 0x18);
          local_1b8[0] = (undefined1)((ulong)uVar9 >> 0x38);
          bVar13 = CTxMemPool::exists((CTxMemPool *)local_680,(GenTxid *)local_1c8);
          __args_00 = &peVar3->m_witness_hash;
          txid = &peVar3->hash;
          if (bVar13) {
            pCVar16 = CTxMemPool::GetEntry((CTxMemPool *)local_680,txid);
            local_1c8._0_4_ = SUB84(pCVar16,0);
            local_1c8._4_4_ = (undefined4)((ulong)pCVar16 >> 0x20);
            ppCVar17 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                                 ((CTxMemPoolEntry **)local_1c8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                  ,0x6e0,"AcceptPackage","m_pool.GetEntry(txid)");
            pCVar16 = *ppCVar17;
            iVar14 = GetVirtualTransactionSize
                               ((long)pCVar16->nTxWeight,pCVar16->sigOpCost,nBytesPerSigOp);
            local_178._M_right = (_Base_ptr)(long)(int)iVar14;
            local_150 = (_Storage<long,_true>)pCVar16->nFee;
            local_1c8._0_4_ = M_ERROR;
            _Stack_1c0._M_p._0_4_ = _S_red;
            _Stack_1c0._M_p._4_4_ = TX_RESULT_UNSET;
            local_1b8 = (undefined1  [8])local_1a8;
            auStack_1b0[0] = '\0';
            auStack_1b0[1] = '\0';
            auStack_1b0[2] = '\0';
            auStack_1b0[3] = '\0';
            auStack_1b0[4] = '\0';
            auStack_1b0[5] = '\0';
            auStack_1b0[6] = '\0';
            auStack_1b0[7] = '\0';
            local_1a8[0] = false;
            local_198._M_p = local_188;
            local_190 = (undefined1  [8])0x0;
            local_188[0] = _S_red;
            local_178._0_8_ = &local_178;
            local_178._M_left = (_Base_ptr)0x0;
            local_158 = true;
            local_148 = true;
            local_138 = false;
            local_118 = false;
            local_f0 = false;
            local_178._M_parent = (_Base_ptr)local_178._0_8_;
            std::
            _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                      ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                        *)&local_b0,__args_00,(MempoolAcceptResult *)local_1c8);
            if ((local_118 == true) &&
               (local_118 = false,
               local_130._M_value.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_130._M_value.
                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_130._M_value.
                                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              local_130._0_8_);
            }
            std::__cxx11::
            _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)&local_178);
            if ((_Base_ptr)local_198._M_p != (_Base_ptr)local_188) {
              operator_delete(local_198._M_p,CONCAT71(local_188._1_7_,local_188[0]) + 1);
            }
            in_stack_fffffffffffff8a0 = __x;
            if (local_1b8 != (undefined1  [8])local_1a8) {
              operator_delete((void *)local_1b8,
                              CONCAT35(local_1a8._5_3_,CONCAT41(local_1a8._1_4_,local_1a8[0])) + 1);
              in_stack_fffffffffffff8a0 = __x;
            }
          }
          else {
            uVar8 = *(undefined8 *)(txid->m_wrapped).super_base_blob<256U>.m_data._M_elems;
            uVar9 = *(undefined8 *)
                     ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            uVar10 = *(undefined8 *)
                      ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            uVar11 = *(undefined8 *)
                      ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            local_1b8._1_3_ = (undefined3)uVar10;
            local_1b8._4_4_ = (undefined4)((ulong)uVar10 >> 0x18);
            auStack_1b0[0] = (undefined1)((ulong)uVar10 >> 0x38);
            auStack_1b0._1_3_ = (undefined3)uVar11;
            auStack_1b0._4_4_ = (undefined4)((ulong)uVar11 >> 0x18);
            local_1a8[0] = (undefined1)((ulong)uVar11 >> 0x38);
            local_1c8._1_3_ = (undefined3)uVar8;
            local_1c8._0_4_ = (uint)(uint3)local_1c8._1_3_ << 8;
            local_1c8._4_4_ = (undefined4)((ulong)uVar8 >> 0x18);
            _Stack_1c0._M_p._0_1_ = SUB81((ulong)uVar8 >> 0x38,0);
            _Stack_1c0._M_p._1_3_ = (undefined3)uVar9;
            _Stack_1c0._M_p._4_4_ = (TxValidationResult)((ulong)uVar9 >> 0x18);
            local_1b8[0] = (undefined1)((ulong)uVar9 >> 0x38);
            bVar13 = CTxMemPool::exists((CTxMemPool *)local_680,(GenTxid *)local_1c8);
            if (bVar13) {
              pCVar16 = CTxMemPool::GetEntry((CTxMemPool *)local_680,txid);
              local_1c8._0_4_ = SUB84(pCVar16,0);
              local_1c8._4_4_ = (undefined4)((ulong)pCVar16 >> 0x20);
              ppCVar17 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                                   ((CTxMemPoolEntry **)local_1c8,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                    ,0x6ea,"AcceptPackage","m_pool.GetEntry(txid)");
              peVar3 = ((*ppCVar17)->tx).
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_1c8._0_4_ = M_ERROR|M_INVALID;
              _Stack_1c0._M_p._0_4_ = _S_red;
              _Stack_1c0._M_p._4_4_ = TX_RESULT_UNSET;
              local_1b8 = (undefined1  [8])local_1a8;
              auStack_1b0[0] = '\0';
              auStack_1b0[1] = '\0';
              auStack_1b0[2] = '\0';
              auStack_1b0[3] = '\0';
              auStack_1b0[4] = '\0';
              auStack_1b0[5] = '\0';
              auStack_1b0[6] = '\0';
              auStack_1b0[7] = '\0';
              local_1a8[0] = false;
              local_198._M_p = local_188;
              local_190 = (undefined1  [8])0x0;
              local_188[0] = _S_red;
              local_178._0_8_ = &local_178;
              local_178._M_left = (_Base_ptr)0x0;
              local_158 = false;
              local_148 = false;
              local_138 = false;
              local_118 = false;
              local_110._0_8_ =
                   *(undefined8 *)
                    (peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              local_110._8_8_ =
                   *(undefined8 *)
                    ((long)&(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data + 8);
              local_110._16_8_ =
                   *(undefined8 *)
                    ((long)&(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data + 0x10);
              local_110._24_8_ =
                   *(undefined8 *)
                    ((long)&(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data + 0x18);
              local_f0 = true;
              local_178._M_parent = (_Base_ptr)local_178._0_8_;
              std::
              _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
              ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                        ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                          *)&local_b0,__args_00,(MempoolAcceptResult *)local_1c8);
              if ((local_118 == true) &&
                 (local_118 = false,
                 local_130._M_value.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                operator_delete(local_130._M_value.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_130._M_value.
                                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                local_130._0_8_);
              }
              std::__cxx11::
              _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)&local_178);
              auVar28 = local_1b8;
              if ((_Base_ptr)local_198._M_p != (_Base_ptr)local_188) {
                operator_delete(local_198._M_p,CONCAT71(local_188._1_7_,local_188[0]) + 1);
                auVar28 = local_1b8;
              }
              local_1b8 = auVar28;
              if (auVar28 != (undefined1  [8])local_1a8) {
                lVar27 = CONCAT35(local_1a8._5_3_,CONCAT41(local_1a8._1_4_,local_1a8[0]));
LAB_00aec4b2:
                operator_delete((void *)auVar28,lVar27 + 1);
              }
            }
            else {
              local_290 = (undefined1  [8])
                          (__x->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr;
              local_288._M_pi =
                   (__x->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
                }
              }
              __l._M_len = 1;
              __l._M_array = (iterator)local_290;
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)local_248,__l,(allocator_type *)local_2d8);
              anon_unknown.dwarf_3f792fb::MemPoolAccept::AcceptSubPackage
                        ((PackageMempoolAcceptResult *)local_1c8,(MemPoolAccept *)local_680,
                         (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)local_248,&local_6d0);
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *)local_248);
              if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
              }
              pmVar20 = std::
                        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                              *)(local_188 + 8),&__args_00->m_wrapped);
              if (pmVar20->m_result_type == VALID) {
                local_248[0] = true;
                uVar8 = *(undefined8 *)(__args_00->m_wrapped).super_base_blob<256U>.m_data._M_elems;
                uVar9 = *(undefined8 *)
                         ((__args_00->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
                uVar10 = *(undefined8 *)
                          ((__args_00->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
                uVar11 = *(undefined8 *)
                          ((__args_00->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
                local_248._17_7_ = (undefined7)uVar10;
                aStack_230._M_local_buf[0] = (char)((ulong)uVar10 >> 0x38);
                aStack_230._1_7_ = (undefined7)uVar11;
                aStack_230._M_local_buf[8] = (char)((ulong)uVar11 >> 0x38);
                local_248._1_7_ = (undefined7)uVar8;
                local_248[8] = (undefined1)((ulong)uVar8 >> 0x38);
                local_248._9_7_ = (undefined7)uVar9;
                local_248[0x10] = (undefined1)((ulong)uVar9 >> 0x38);
                bVar13 = CTxMemPool::exists((CTxMemPool *)local_680,(GenTxid *)local_248);
                if (!bVar13) {
                  __assert_fail("m_pool.exists(GenTxid::Wtxid(wtxid))",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                ,0x6f5,
                                "PackageMempoolAcceptResult (anonymous namespace)::MemPoolAccept::AcceptPackage(const Package &, ATMPArgs &)"
                               );
                }
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&local_b0,__args_00,pmVar20);
              }
              else {
                TVar1 = (pmVar20->m_state).super_ValidationState<TxValidationResult>.m_result;
                if ((TVar1 == TX_MISSING_INPUTS) || (TVar1 == TX_RECONSIDERABLE)) {
                  std::
                  _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                  ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                            ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                              *)&local_e0,__args_00,pmVar20);
                  std::
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::push_back(&local_738,__x);
                }
                else {
                  local_248[0] = SUB81(local_248 + 0x10,0);
                  local_248._1_7_ = (undefined7)((ulong)(local_248 + 0x10) >> 8);
                  local_290 = (undefined1  [8])0x12;
                  pcVar15 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_248,(size_type *)local_290,0);
                  local_248[0] = SUB81(pcVar15,0);
                  local_248._1_7_ = (undefined7)((ulong)pcVar15 >> 8);
                  local_248[0x10] = local_290[0];
                  local_248._17_7_ = local_290._1_7_;
                  builtin_strncpy(pcVar15,"transaction failed",0x12);
                  pcVar15[(long)local_290] = '\0';
                  local_288._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_280[0] = '\0';
                  pvVar25 = in_stack_fffffffffffff898;
                  local_290 = (undefined1  [8])local_280;
                  local_248[8] = local_248[0x10];
                  local_248._9_7_ = local_248._17_7_;
                  ValidationState<PackageValidationResult>::Invalid
                            ((ValidationState<PackageValidationResult> *)&local_80,PCKG_TX,
                             (string *)local_248,(string *)local_290);
                  in_stack_fffffffffffff898 = pvVar25;
                  if (local_290 != (undefined1  [8])local_280) {
                    operator_delete((void *)local_290,CONCAT71(local_280._1_7_,local_280[0]) + 1);
                  }
                  puVar18 = local_248 + 0x10;
                  if ((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]) != puVar18) {
                    operator_delete((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]),
                                    CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
                    puVar18 = extraout_RAX;
                  }
                  in_stack_fffffffffffff891 = (undefined7)((ulong)puVar18 >> 8);
                  in_stack_fffffffffffff890 = 1;
                  std::
                  _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                  ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                            ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                              *)&local_e0,__args_00,pmVar20);
                }
              }
              std::
              _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                           *)(local_188 + 8));
              if ((undefined1 *)local_1a8._8_8_ != local_190) {
                operator_delete((void *)local_1a8._8_8_,(ulong)((long)local_190 + 1));
              }
              auVar28 = (undefined1  [8])
                        CONCAT44(_Stack_1c0._M_p._4_4_,(_Rb_tree_color)_Stack_1c0._M_p);
              if (auVar28 != (undefined1  [8])auStack_1b0) {
                lVar27 = CONCAT44(auStack_1b0._4_4_,auStack_1b0._0_4_);
                goto LAB_00aec4b2;
              }
            }
          }
          __x = __x + 1;
        } while (__x != pvVar25);
        if ((in_stack_fffffffffffff890 & 1) == 0) goto LAB_00aec4ce;
LAB_00aec503:
        local_290 = (undefined1  [8])local_80;
        local_288._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_280 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_288,local_78._M_p,local_78._M_p + local_70);
        local_268[0] = (pointer)local_258;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_268,local_58._M_p,local_50 + (long)local_58._M_p);
        auStack_1b0 = (undefined1  [8])&_Stack_1c0;
        local_1b8[0] = '\0';
        local_1b8[1] = '\0';
        local_1b8[2] = '\0';
        local_1b8[3] = '\0';
        local_1b8[4] = '\0';
        local_1b8[5] = '\0';
        local_1b8[6] = '\0';
        local_1b8[7] = '\0';
        local_1c8._0_4_ = M_VALID;
        local_1c8._4_4_ = PCKG_RESULT_UNSET;
        _Stack_1c0._M_p._0_4_ = _S_red;
        _Stack_1c0._M_p._4_4_ = TX_RESULT_UNSET;
        local_1a8[0] = SUB81(auStack_1b0,0);
        local_1a8._1_4_ = (undefined4)((ulong)auStack_1b0 >> 8);
        local_1a8._5_3_ = (undefined3)((ulong)auStack_1b0 >> 0x28);
        local_1a8._8_8_ = (_Storage<CFeeRate,_true>)0x0;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)__args_00;
        state_02.super_ValidationState<PackageValidationResult>.m_mode =
             (int)in_stack_fffffffffffff868;
        state_02.super_ValidationState<PackageValidationResult>.m_result =
             (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)package;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)__return_storage_ptr__;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_4_ =
             in_stack_fffffffffffff888;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._12_4_ =
             uVar30;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
        _0_1_ = in_stack_fffffffffffff890;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
        _1_7_ = in_stack_fffffffffffff891;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)in_stack_fffffffffffff898;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)in_stack_fffffffffffff8a0;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             hash._M_p;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  ((PackageMempoolAcceptResult *)local_248,state_02,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)local_290);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)local_1c8);
        if (local_268[0] != (pointer)local_258) {
          operator_delete(local_268[0],(ulong)((long)(CAmount *)local_258._0_8_ + 1));
        }
        if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_280 + 8)) {
          operator_delete(local_288._M_pi,(ulong)(local_280._8_8_ + 1));
        }
      }
      auVar28 = local_680;
      pCVar22 = Chainstate::CoinsTip(local_400);
      LimitMempoolSize((CTxMemPool *)auVar28,pCVar22);
      ppsVar33 = (pointer *)
                 (package->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pPVar34 = (Package *)
                (package->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      pPVar12 = pPVar34;
      if ((Package *)ppsVar33 != pPVar34) {
        do {
          package = pPVar12;
          lVar27 = (long)*ppsVar33;
          __args = (transaction_identifier<true> *)(lVar27 + 0x59);
          cVar19 = std::
                   _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   ::find(&local_200,(key_type *)__args);
          if ((_Rb_tree_header *)cVar19._M_node == &local_200._M_impl.super__Rb_tree_header) {
            iVar21 = std::
                     _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     ::find(&local_b0,(key_type *)__args);
            if ((_Rb_tree_header *)iVar21._M_node == &local_b0._M_impl.super__Rb_tree_header) {
              iVar21 = std::
                       _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       ::find(&local_e0,(key_type *)__args);
              if ((_Rb_tree_header *)iVar21._M_node != &local_e0._M_impl.super__Rb_tree_header) {
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult&>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&local_b0,__args,(MempoolAcceptResult *)(iVar21._M_node + 2));
              }
            }
            else {
              std::
              _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              ::find(&local_e0,(key_type *)__args);
              lVar27 = (long)*ppsVar33;
              uVar8 = *(undefined8 *)(lVar27 + 0x39);
              uVar9 = *(undefined8 *)(lVar27 + 0x41);
              uVar10 = *(undefined8 *)(lVar27 + 0x49);
              uVar11 = *(undefined8 *)(lVar27 + 0x51);
              local_1b8._1_3_ = (undefined3)uVar10;
              local_1b8._4_4_ = (undefined4)((ulong)uVar10 >> 0x18);
              auStack_1b0[0] = (undefined1)((ulong)uVar10 >> 0x38);
              auStack_1b0._1_3_ = (undefined3)uVar11;
              auStack_1b0._4_4_ = (undefined4)((ulong)uVar11 >> 0x18);
              local_1a8[0] = (undefined1)((ulong)uVar11 >> 0x38);
              local_1c8._1_3_ = (undefined3)uVar8;
              local_1c8._0_4_ = (uint)(uint3)local_1c8._1_3_ << 8;
              local_1c8._4_4_ = (undefined4)((ulong)uVar8 >> 0x18);
              _Stack_1c0._M_p._0_1_ = SUB81((ulong)uVar8 >> 0x38,0);
              _Stack_1c0._M_p._1_3_ = (undefined3)uVar9;
              _Stack_1c0._M_p._4_4_ = (TxValidationResult)((ulong)uVar9 >> 0x18);
              local_1b8[0] = (undefined1)((ulong)uVar9 >> 0x38);
              bVar13 = CTxMemPool::exists((CTxMemPool *)local_680,(GenTxid *)local_1c8);
              if (!bVar13) {
                local_1c8 = (undefined1  [8])local_1b8;
                local_2d8._0_8_ = (pointer)0x12;
                pcVar15 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1c8,(size_type *)local_2d8,0);
                local_1c8._0_4_ = SUB84(pcVar15,0);
                local_1c8._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
                local_1b8._0_4_ = (undefined4)local_2d8._0_8_;
                local_1b8._4_4_ = SUB84(local_2d8._0_8_,4);
                builtin_strncpy(pcVar15,"transaction failed",0x12);
                pcVar15[local_2d8._0_8_] = '\0';
                local_2d8._8_8_ = (pointer)0x0;
                local_2d8._16_8_ = local_2d8._16_8_ & 0xffffffffffffff00;
                pPVar34 = package;
                local_2d8._0_8_ = local_2d8 + 0x10;
                _Stack_1c0._M_p._0_4_ = local_1b8._0_4_;
                _Stack_1c0._M_p._4_4_ = local_1b8._4_4_;
                ValidationState<PackageValidationResult>::Invalid
                          ((ValidationState<PackageValidationResult> *)local_248,PCKG_TX,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c8,(string *)local_2d8);
                package = pPVar34;
                if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                  operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                }
                if ((undefined1 *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != local_1b8) {
                  operator_delete((undefined1 *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                                  CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1);
                }
                local_2d8._0_8_ = (_Base_ptr)0x0;
                local_2d8._8_8_ = &local_2c0;
                local_2d8._16_8_ = 0;
                local_2c0._M_local_buf[0] = '\0';
                local_2b0._M_p = (pointer)&local_2a0;
                local_2a8 = 0;
                local_2a0._M_local_buf[0] = '\0';
                local_1c8 = (undefined1  [8])local_1b8;
                local_1b8[0] = 'm';
                local_1b8[1] = 'e';
                local_1b8[2] = 'm';
                local_1b8[3] = 'p';
                local_1b8[4] = 'o';
                local_1b8[5] = 'o';
                local_1b8[6] = 'l';
                local_1b8[7] = ' ';
                auStack_1b0[0] = 'f';
                auStack_1b0[1] = 'u';
                auStack_1b0[2] = 'l';
                auStack_1b0[3] = 'l';
                _Stack_1c0._M_p._0_4_ = 0xc;
                _Stack_1c0._M_p._4_4_ = TX_RESULT_UNSET;
                auStack_1b0._4_4_ = auStack_1b0._4_4_ & 0xffffff00;
                local_2f8._M_string_length = 0;
                local_2f8.field_2._M_local_buf[0] = '\0';
                local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                ValidationState<TxValidationResult>::Invalid
                          ((ValidationState<TxValidationResult> *)local_2d8,TX_MEMPOOL_POLICY,
                           (string *)local_1c8,&local_2f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                  operator_delete(local_2f8._M_dataplus._M_p,
                                  CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                                           local_2f8.field_2._M_local_buf[0]) + 1);
                }
                if (local_1c8 != (undefined1  [8])local_1b8) {
                  operator_delete((void *)local_1c8,CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1);
                }
                pVar35 = std::
                         _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                         ::equal_range(&local_b0,(key_type *)__args);
                std::
                _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                ::_M_erase_aux(&local_b0,(_Base_ptr)pVar35.first._M_node,
                               (_Base_ptr)pVar35.second._M_node);
                local_388 = (_Base_ptr)local_2d8._0_8_;
                local_380[0] = local_370;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_380,local_2d8._8_8_,
                           (char *)(local_2d8._8_8_ + local_2d8._16_8_));
                local_360[0] = local_350;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_360,local_2b0._M_p,local_2b0._M_p + local_2a8);
                state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                     = (pointer)__args_00;
                state_03.super_ValidationState<TxValidationResult>.m_mode =
                     (int)in_stack_fffffffffffff868;
                state_03.super_ValidationState<TxValidationResult>.m_result =
                     (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
                state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length
                     = (size_type)package;
                state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)__return_storage_ptr__;
                state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_4_ =
                     in_stack_fffffffffffff888;
                state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._12_4_ =
                     uVar30;
                state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _0_1_ = in_stack_fffffffffffff890;
                state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _1_7_ = in_stack_fffffffffffff891;
                state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length
                     = (size_type)in_stack_fffffffffffff898;
                state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity = (size_type)in_stack_fffffffffffff8a0;
                state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     hash._M_p;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)local_1c8,state_03);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&local_b0,__args,(MempoolAcceptResult *)local_1c8);
                if ((local_118 == true) &&
                   (local_118 = false,
                   local_130._M_value.
                   super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                  operator_delete(local_130._M_value.
                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_130._M_value.
                                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  local_130._0_8_);
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)&local_178);
                if ((_Base_ptr)local_198._M_p != (_Base_ptr)local_188) {
                  operator_delete(local_198._M_p,CONCAT71(local_188._1_7_,local_188[0]) + 1);
                }
                if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1a8) {
                  operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),
                                  CONCAT35(local_1a8._5_3_,CONCAT41(local_1a8._1_4_,local_1a8[0])) +
                                  1);
                }
                if (local_360[0] != local_350) {
                  operator_delete(local_360[0],(long)local_350[0] + 1);
                }
                pAVar26 = local_370[0];
                ppAVar29 = local_380[0];
                if (local_380[0] != local_370) goto LAB_00aece5f;
                goto LAB_00aece67;
              }
            }
          }
          else {
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            ::find(&local_b0,(key_type *)__args);
            pmVar20 = std::
                      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                            *)&local_200,(key_type *)__args);
            if (pmVar20->m_result_type == VALID) {
              uVar8 = *(undefined8 *)(__args->m_wrapped).super_base_blob<256U>.m_data._M_elems;
              uVar9 = *(undefined8 *)(lVar27 + 0x61);
              uVar10 = *(undefined8 *)(lVar27 + 0x69);
              uVar11 = *(undefined8 *)(lVar27 + 0x71);
              local_1b8._1_3_ = (undefined3)uVar10;
              local_1b8._4_4_ = (undefined4)((ulong)uVar10 >> 0x18);
              auStack_1b0[0] = (undefined1)((ulong)uVar10 >> 0x38);
              auStack_1b0._1_3_ = (undefined3)uVar11;
              auStack_1b0._4_4_ = (undefined4)((ulong)uVar11 >> 0x18);
              local_1a8[0] = (undefined1)((ulong)uVar11 >> 0x38);
              local_1c8._1_3_ = (undefined3)uVar8;
              local_1c8[0] = 1;
              local_1c8._4_4_ = (undefined4)((ulong)uVar8 >> 0x18);
              _Stack_1c0._M_p._0_1_ = SUB81((ulong)uVar8 >> 0x38,0);
              _Stack_1c0._M_p._1_3_ = (undefined3)uVar9;
              _Stack_1c0._M_p._4_4_ = (TxValidationResult)((ulong)uVar9 >> 0x18);
              local_1b8[0] = (undefined1)((ulong)uVar9 >> 0x38);
              bVar13 = CTxMemPool::exists((CTxMemPool *)local_680,(GenTxid *)local_1c8);
              if (!bVar13) {
                local_1c8 = (undefined1  [8])local_1b8;
                local_2d8._0_8_ = (pointer)0x12;
                pcVar15 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1c8,(size_type *)local_2d8,0);
                local_1c8._0_4_ = SUB84(pcVar15,0);
                local_1c8._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
                local_1b8._0_4_ = (undefined4)local_2d8._0_8_;
                local_1b8._4_4_ = SUB84(local_2d8._0_8_,4);
                builtin_strncpy(pcVar15,"transaction failed",0x12);
                pcVar15[local_2d8._0_8_] = '\0';
                local_2d8._8_8_ = (pointer)0x0;
                local_2d8._16_8_ = local_2d8._16_8_ & 0xffffffffffffff00;
                pPVar34 = package;
                local_2d8._0_8_ = local_2d8 + 0x10;
                _Stack_1c0._M_p._0_4_ = local_1b8._0_4_;
                _Stack_1c0._M_p._4_4_ = local_1b8._4_4_;
                ValidationState<PackageValidationResult>::Invalid
                          ((ValidationState<PackageValidationResult> *)local_248,PCKG_TX,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c8,(string *)local_2d8);
                package = pPVar34;
                if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                  operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                }
                if ((undefined1 *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != local_1b8) {
                  operator_delete((undefined1 *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                                  CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1);
                }
                local_2d8._0_8_ = (_Base_ptr)0x0;
                local_2d8._8_8_ = &local_2c0;
                local_2d8._16_8_ = 0;
                local_2c0._M_local_buf[0] = '\0';
                local_2b0._M_p = (pointer)&local_2a0;
                local_2a8 = 0;
                local_2a0._M_local_buf[0] = '\0';
                local_1c8 = (undefined1  [8])local_1b8;
                local_1b8[0] = 'm';
                local_1b8[1] = 'e';
                local_1b8[2] = 'm';
                local_1b8[3] = 'p';
                local_1b8[4] = 'o';
                local_1b8[5] = 'o';
                local_1b8[6] = 'l';
                local_1b8[7] = ' ';
                auStack_1b0[0] = 'f';
                auStack_1b0[1] = 'u';
                auStack_1b0[2] = 'l';
                auStack_1b0[3] = 'l';
                _Stack_1c0._M_p._0_4_ = 0xc;
                _Stack_1c0._M_p._4_4_ = TX_RESULT_UNSET;
                auStack_1b0._4_4_ = auStack_1b0._4_4_ & 0xffffff00;
                local_2f8._M_string_length = 0;
                local_2f8.field_2._M_local_buf[0] = '\0';
                local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                ValidationState<TxValidationResult>::Invalid
                          ((ValidationState<TxValidationResult> *)local_2d8,TX_MEMPOOL_POLICY,
                           (string *)local_1c8,&local_2f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                  operator_delete(local_2f8._M_dataplus._M_p,
                                  CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                                           local_2f8.field_2._M_local_buf[0]) + 1);
                }
                if (local_1c8 != (undefined1  [8])local_1b8) {
                  operator_delete((void *)local_1c8,CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1);
                }
                local_340 = (_Base_ptr)local_2d8._0_8_;
                local_338[0] = local_328;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_338,local_2d8._8_8_,
                           (char *)(local_2d8._8_8_ + local_2d8._16_8_));
                local_318[0] = local_308;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_318,local_2b0._M_p,local_2b0._M_p + local_2a8);
                state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                     = (pointer)__args_00;
                state_04.super_ValidationState<TxValidationResult>.m_mode =
                     (int)in_stack_fffffffffffff868;
                state_04.super_ValidationState<TxValidationResult>.m_result =
                     (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
                state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length
                     = (size_type)package;
                state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)__return_storage_ptr__;
                state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_4_ =
                     in_stack_fffffffffffff888;
                state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._12_4_ =
                     uVar30;
                state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _0_1_ = in_stack_fffffffffffff890;
                state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _1_7_ = in_stack_fffffffffffff891;
                state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length
                     = (size_type)in_stack_fffffffffffff898;
                state_04.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity = (size_type)in_stack_fffffffffffff8a0;
                state_04.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     hash._M_p;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)local_1c8,state_04);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&local_b0,__args,(MempoolAcceptResult *)local_1c8);
                if ((local_118 == true) &&
                   (local_118 = false,
                   local_130._M_value.
                   super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                  operator_delete(local_130._M_value.
                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_130._M_value.
                                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  local_130._0_8_);
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)&local_178);
                if ((_Base_ptr)local_198._M_p != (_Base_ptr)local_188) {
                  operator_delete(local_198._M_p,CONCAT71(local_188._1_7_,local_188[0]) + 1);
                }
                if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1a8) {
                  operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),
                                  CONCAT35(local_1a8._5_3_,CONCAT41(local_1a8._1_4_,local_1a8[0])) +
                                  1);
                }
                if (local_318[0] != local_308) {
                  operator_delete(local_318[0],local_308[0] + 1);
                }
                pAVar26 = local_328[0];
                ppAVar29 = local_338[0];
                if (local_338[0] != local_328) {
LAB_00aece5f:
                  operator_delete(ppAVar29,(ulong)((long)&pAVar26->height + 1));
                }
LAB_00aece67:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._M_p != &local_2a0) {
                  operator_delete(local_2b0._M_p,
                                  CONCAT71(local_2a0._M_allocated_capacity._1_7_,
                                           local_2a0._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d8._8_8_ != &local_2c0) {
                  operator_delete((void *)local_2d8._8_8_,
                                  CONCAT71(local_2c0._1_7_,local_2c0._M_local_buf[0]) + 1);
                }
                goto LAB_00aeceb1;
              }
            }
            std::
            _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                      ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                        *)&local_b0,__args,pmVar20);
          }
LAB_00aeceb1:
          ppsVar33 = ppsVar33 + 2;
          pPVar12 = package;
        } while ((Package *)ppsVar33 != pPVar34);
      }
      local_1c8._0_4_ = (undefined4)CONCAT71(local_248._1_7_,local_248[0]);
      local_1c8._4_4_ = SUB74(local_248._1_7_,3);
      _Stack_1c0._M_p = auStack_1b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_1c0,CONCAT71(local_248._9_7_,local_248[8]),
                 CONCAT71(local_248._17_7_,local_248[0x10]) + CONCAT71(local_248._9_7_,local_248[8])
                );
      local_1a8._8_8_ = local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1a8 + 8),local_220._M_p,local_220._M_p + local_218);
      state_05.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)__args_00;
      state_05.super_ValidationState<PackageValidationResult>.m_mode =
           (int)in_stack_fffffffffffff868;
      state_05.super_ValidationState<PackageValidationResult>.m_result =
           (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
      state_05.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
           (size_type)package;
      state_05.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = (size_type)__return_storage_ptr__;
      state_05.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_4_ =
           in_stack_fffffffffffff888;
      state_05.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._12_4_ =
           uVar30;
      state_05.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._0_1_
           = in_stack_fffffffffffff890;
      state_05.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._1_7_
           = in_stack_fffffffffffff891;
      state_05.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
           (size_type)in_stack_fffffffffffff898;
      state_05.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity = (size_type)in_stack_fffffffffffff8a0;
      state_05.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
           hash._M_p;
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                (__return_storage_ptr__,state_05,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)local_1c8);
      cVar36 = (char)uVar30;
      if ((undefined1 *)local_1a8._8_8_ != local_190) {
        operator_delete((void *)local_1a8._8_8_,(ulong)((long)local_190 + 1));
      }
      if (_Stack_1c0._M_p != auStack_1b0) {
        operator_delete(_Stack_1c0._M_p,
                        (ulong)((long)&(((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)
                                        &((_Base_ptr)auStack_1b0)->_M_color)->_M_impl).
                                       super__Vector_impl_data._M_start + 1));
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree(&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_p != &local_210) {
        operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_248._9_7_,local_248[8]) != &aStack_230) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_248._9_7_,local_248[8]),
                        CONCAT71(aStack_230._1_7_,aStack_230._M_local_buf[0]) + 1);
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&local_738);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree(&local_e0);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree(&local_b0);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_690);
    }
    else {
      local_248[0] = '*';
      local_248[1] = '\0';
      local_248[2] = '\0';
      local_248[3] = '\0';
      local_248[4] = '\0';
      local_248[5] = '\0';
      local_248[6] = '\0';
      local_248[7] = '\0';
      local_1c8 = (undefined1  [8])local_1b8;
      pcVar15 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1c8,(size_type *)local_248,0);
      local_1c8._0_4_ = SUB84(pcVar15,0);
      local_1c8._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
      puVar18 = local_248 + 0x10;
      local_1b8._0_4_ = (undefined4)CONCAT71(local_248._1_7_,local_248[0]);
      local_1b8._4_4_ = SUB74(local_248._1_7_,3);
      builtin_strncpy(pcVar15,"package-not-child-with-unconfirmed-parents",0x2a);
      pcVar15[CONCAT71(local_248._1_7_,local_248[0])] = '\0';
      local_248[0] = SUB81(puVar18,0);
      local_248._1_7_ = (undefined7)((ulong)puVar18 >> 8);
      local_248[8] = _S_red;
      local_248._9_7_ = 0;
      local_248[0x10] = '\0';
      _Stack_1c0._M_p._0_4_ = local_1b8._0_4_;
      _Stack_1c0._M_p._4_4_ = local_1b8._4_4_;
      ValidationState<PackageValidationResult>::Invalid
                ((ValidationState<PackageValidationResult> *)&local_80,PCKG_POLICY,
                 (string *)local_1c8,(string *)local_248);
      if ((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]) != puVar18) {
        operator_delete((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]),
                        CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
      }
      if ((CChainParams *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != (CChainParams *)local_1b8) {
        operator_delete((CChainParams *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                        CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1);
      }
      local_1c8._0_4_ = SUB84(local_80,0);
      local_1c8._4_4_ = (undefined4)((ulong)local_80 >> 0x20);
      _Stack_1c0._M_p = auStack_1b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_1c0,local_78._M_p,local_78._M_p + local_70);
      local_1a8._8_8_ = local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1a8 + 8),local_58._M_p,local_50 + (long)local_58._M_p);
      local_248[0x10] = '\0';
      local_248._17_7_ = 0;
      local_248[0] = false;
      local_248[1] = '\0';
      local_248[2] = '\0';
      local_248[3] = '\0';
      local_248[4] = '\0';
      local_248[5] = '\0';
      local_248[6] = '\0';
      local_248[7] = '\0';
      local_248[8] = _S_red;
      local_248._9_7_ = 0;
      aStack_230._M_local_buf[0] = (char)(local_248 + 8);
      aStack_230._1_7_ = (undefined7)((ulong)(local_248 + 8) >> 8);
      local_220._M_p = (pointer)0x0;
      state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)__args_00;
      state_01.super_ValidationState<PackageValidationResult>.m_mode =
           (int)in_stack_fffffffffffff868;
      state_01.super_ValidationState<PackageValidationResult>.m_result =
           (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
      state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
           (size_type)package;
      state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = (size_type)__return_storage_ptr__;
      state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_4_ =
           in_stack_fffffffffffff888;
      state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._12_4_ =
           uVar30;
      state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._0_1_
           = in_stack_fffffffffffff890;
      state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._1_7_
           = in_stack_fffffffffffff891;
      state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
           (size_type)in_stack_fffffffffffff898;
      state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity = (size_type)in_stack_fffffffffffff8a0;
      state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
           hash._M_p;
      aStack_230._M_local_buf[8] = aStack_230._M_local_buf[0];
      aStack_230._9_7_ = aStack_230._1_7_;
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                (__return_storage_ptr__,state_01,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)local_1c8);
      cVar36 = (char)uVar30;
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)local_248);
      if ((undefined1 *)local_1a8._8_8_ != local_190) {
        operator_delete((void *)local_1a8._8_8_,(ulong)((long)local_190 + 1));
      }
      if (_Stack_1c0._M_p != auStack_1b0) {
        operator_delete(_Stack_1c0._M_p,CONCAT44(auStack_1b0._4_4_,auStack_1b0._0_4_) + 1);
      }
    }
    std::
    _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_718);
  }
  else {
    local_1c8._0_4_ = SUB84(local_80,0);
    local_1c8._4_4_ = (undefined4)((ulong)local_80 >> 0x20);
    _Stack_1c0._M_p = auStack_1b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_1c0,local_78._M_p,local_78._M_p + local_70);
    local_1a8._8_8_ = local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1a8 + 8),local_58._M_p,local_50 + (long)local_58._M_p);
    local_248[0x10] = '\0';
    local_248._17_7_ = 0;
    local_248[0] = false;
    local_248[1] = '\0';
    local_248[2] = '\0';
    local_248[3] = '\0';
    local_248[4] = '\0';
    local_248[5] = '\0';
    local_248[6] = '\0';
    local_248[7] = '\0';
    local_248[8] = _S_red;
    local_248._9_7_ = 0;
    aStack_230._M_local_buf[0] = (char)(local_248 + 8);
    aStack_230._1_7_ = (undefined7)((ulong)(local_248 + 8) >> 8);
    local_220._M_p = (pointer)0x0;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)in_stack_fffffffffffff870;
    state.super_ValidationState<PackageValidationResult>.m_mode = (int)in_stack_fffffffffffff868;
    state.super_ValidationState<PackageValidationResult>.m_result =
         (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
         (size_type)package;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity = (size_type)__return_storage_ptr__;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_4_ =
         in_stack_fffffffffffff888;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._12_4_ = uVar30;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._0_1_ =
         in_stack_fffffffffffff890;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._1_7_ =
         in_stack_fffffffffffff891;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
         (size_type)in_stack_fffffffffffff898;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity = (size_type)in_stack_fffffffffffff8a0;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ = hash._M_p;
    aStack_230._M_local_buf[8] = aStack_230._M_local_buf[0];
    aStack_230._9_7_ = aStack_230._1_7_;
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              (__return_storage_ptr__,state,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)local_1c8);
    cVar36 = (char)uVar30;
LAB_00aebb3f:
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 *)local_248);
    if ((undefined1 *)local_1a8._8_8_ != local_190) {
      operator_delete((void *)local_1a8._8_8_,(ulong)((long)local_190 + 1));
    }
    if (_Stack_1c0._M_p != auStack_1b0) {
      operator_delete(_Stack_1c0._M_p,CONCAT44(auStack_1b0._4_4_,auStack_1b0._0_4_) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,
                    CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
  }
LAB_00aed050:
  std::__cxx11::
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::_M_clear(&local_3b0);
  std::_Rb_tree<$270907ca$>::~_Rb_tree(&local_3e0);
  local_4b0 = &PTR_GetCoin_013b7300;
  std::
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_458);
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_4a0);
  local_678.super_CCoinsView._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_013bb490;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_508);
  if (local_540 != '\0') {
    (local_548->second).m_prev = local_550;
    (local_550->second).m_next = local_548;
    local_540 = '\0';
  }
  if (0x1c < local_514) {
    free(local_530.indirect_contents.indirect);
    local_530.indirect_contents.indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource((PoolResource<144UL,_8UL> *)(local_648 + 8));
  _Var37._M_p = hash._M_p;
  if ((cVar36 != '\0') ||
     ((__return_storage_ptr__->m_state).super_ValidationState<PackageValidationResult>.m_mode ==
      M_INVALID)) {
    for (; (COutPoint *)hash._M_p != pCStack_750; hash._M_p = hash._M_p + 0x24) {
      pCVar22 = Chainstate::CoinsTip(active_chainstate);
      CCoinsViewCache::Uncache(pCVar22,(COutPoint *)hash._M_p);
    }
  }
  local_680 = (undefined1  [8])0x0;
  local_678.base = (CCoinsView *)0x0;
  local_668._M_local_buf[0] = false;
  local_650 = 0;
  local_648[0] = '\0';
  local_678.super_CCoinsView._vptr_CCoinsView = (_func_int **)&local_668;
  local_658._M_p = local_648;
  Chainstate::FlushStateToDisk(active_chainstate,(BlockValidationState *)local_680,PERIODIC,0);
  if (local_658._M_p != local_648) {
    operator_delete(local_658._M_p,CONCAT71(local_648._1_7_,local_648[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.super_CCoinsView._vptr_CCoinsView != &local_668) {
    operator_delete(local_678.super_CCoinsView._vptr_CCoinsView,
                    CONCAT71(local_668._M_allocated_capacity._1_7_,local_668._M_local_buf[0]) + 1);
  }
  if ((COutPoint *)_Var37._M_p != (COutPoint *)0x0) {
    operator_delete(_Var37._M_p,-(long)_Var37._M_p);
  }
  if (*(uint64_t *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

PackageMempoolAcceptResult ProcessNewPackage(Chainstate& active_chainstate, CTxMemPool& pool,
                                                   const Package& package, bool test_accept, const std::optional<CFeeRate>& client_maxfeerate)
{
    AssertLockHeld(cs_main);
    assert(!package.empty());
    assert(std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;}));

    std::vector<COutPoint> coins_to_uncache;
    const CChainParams& chainparams = active_chainstate.m_chainman.GetParams();
    auto result = [&]() EXCLUSIVE_LOCKS_REQUIRED(cs_main) {
        AssertLockHeld(cs_main);
        if (test_accept) {
            auto args = MemPoolAccept::ATMPArgs::PackageTestAccept(chainparams, GetTime(), coins_to_uncache);
            return MemPoolAccept(pool, active_chainstate).AcceptMultipleTransactions(package, args);
        } else {
            auto args = MemPoolAccept::ATMPArgs::PackageChildWithParents(chainparams, GetTime(), coins_to_uncache, client_maxfeerate);
            return MemPoolAccept(pool, active_chainstate).AcceptPackage(package, args);
        }
    }